

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampDepthCompareCase::init
          (TextureBorderClampDepthCompareCase *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  deUint32 dVar3;
  pointer pIVar4;
  long lVar5;
  long lVar6;
  value_type local_98;
  
  TextureBorderClampTest::init(&this->super_TextureBorderClampTest,ctx);
  paVar1 = &local_98.description.field_2;
  local_98.lookupBias.m_data[0] = 0.0;
  local_98.lookupBias.m_data[1] = 0.0;
  local_98.lookupBias.m_data[2] = 0.0;
  local_98.lookupBias.m_data[3] = 0.0;
  local_98.lookupScale.m_data[0] = 0.0;
  local_98.lookupScale.m_data[1] = 0.0;
  local_98.lookupScale.m_data[2] = 0.0;
  local_98.lookupScale.m_data[3] = 0.0;
  local_98.description._M_string_length = 0;
  local_98.description.field_2._M_local_buf[0] = '\0';
  local_98.p0.m_data[0] = -0.15;
  local_98.p0.m_data[1] = -0.35;
  local_98.p1.m_data[0] = 1.25;
  local_98.p1.m_data[1] = 1.1;
  local_98.borderColor.v._0_8_ = 0x3f333333;
  local_98.borderColor.v._8_8_ = 0;
  local_98.description._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_replace((ulong)&local_98.description,0,(char *)0x0,0x1c5b4a7);
  local_98.compareMode = 0x203;
  local_98.compareRef = 0.5;
  this_00 = &this->m_iterations;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
  ::push_back(this_00,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.description._M_dataplus._M_p != paVar1) {
    operator_delete(local_98.description._M_dataplus._M_p,
                    CONCAT71(local_98.description.field_2._M_allocated_capacity._1_7_,
                             local_98.description.field_2._M_local_buf[0]) + 1);
  }
  local_98.lookupBias.m_data[0] = 0.0;
  local_98.lookupBias.m_data[1] = 0.0;
  local_98.lookupBias.m_data[2] = 0.0;
  local_98.lookupBias.m_data[3] = 0.0;
  local_98.lookupScale.m_data[0] = 0.0;
  local_98.lookupScale.m_data[1] = 0.0;
  local_98.lookupScale.m_data[2] = 0.0;
  local_98.lookupScale.m_data[3] = 0.0;
  local_98.description._M_string_length = 0;
  local_98.description.field_2._M_local_buf[0] = '\0';
  local_98.p0.m_data[0] = -0.15;
  local_98.p0.m_data[1] = -0.35;
  local_98.p1.m_data[0] = 1.25;
  local_98.p1.m_data[1] = 1.1;
  local_98.borderColor.v._0_8_ = 0x3fc00000;
  local_98.borderColor.v._8_8_ = 0;
  local_98.description._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_replace((ulong)&local_98.description,0,(char *)0x0,0x1c5b4c4);
  local_98.compareMode = 0x203;
  local_98.compareRef = 1.0;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
  ::push_back(this_00,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.description._M_dataplus._M_p != paVar1) {
    operator_delete(local_98.description._M_dataplus._M_p,
                    CONCAT71(local_98.description.field_2._M_allocated_capacity._1_7_,
                             local_98.description.field_2._M_local_buf[0]) + 1);
  }
  local_98.lookupBias.m_data[0] = 0.0;
  local_98.lookupBias.m_data[1] = 0.0;
  local_98.lookupBias.m_data[2] = 0.0;
  local_98.lookupBias.m_data[3] = 0.0;
  local_98.lookupScale.m_data[0] = 0.0;
  local_98.lookupScale.m_data[1] = 0.0;
  local_98.lookupScale.m_data[2] = 0.0;
  local_98.lookupScale.m_data[3] = 0.0;
  local_98.description._M_string_length = 0;
  local_98.description.field_2._M_local_buf[0] = '\0';
  local_98.p0.m_data[0] = -0.15;
  local_98.p0.m_data[1] = -0.35;
  local_98.p1.m_data[0] = 1.25;
  local_98.p1.m_data[1] = 1.1;
  local_98.borderColor.v._0_8_ = 0xbf000000;
  local_98.borderColor.v._8_8_ = 0;
  local_98.description._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_replace((ulong)&local_98.description,0,(char *)0x0,0x1c5b4e8);
  local_98.compareMode = 0x206;
  local_98.compareRef = 0.0;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
  ::push_back(this_00,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.description._M_dataplus._M_p != paVar1) {
    operator_delete(local_98.description._M_dataplus._M_p,
                    CONCAT71(local_98.description.field_2._M_allocated_capacity._1_7_,
                             local_98.description.field_2._M_local_buf[0]) + 1);
  }
  local_98.lookupBias.m_data[0] = 0.0;
  local_98.lookupBias.m_data[1] = 0.0;
  local_98.lookupBias.m_data[2] = 0.0;
  local_98.lookupBias.m_data[3] = 0.0;
  local_98.lookupScale.m_data[0] = 0.0;
  local_98.lookupScale.m_data[1] = 0.0;
  local_98.lookupScale.m_data[2] = 0.0;
  local_98.lookupScale.m_data[3] = 0.0;
  local_98.description._M_string_length = 0;
  local_98.description.field_2._M_local_buf[0] = '\0';
  local_98.p0.m_data[0] = -0.15;
  local_98.p0.m_data[1] = -0.35;
  local_98.p1.m_data[0] = 1.25;
  local_98.p1.m_data[1] = 1.1;
  local_98.borderColor.v._0_8_ = 0x7f800000;
  local_98.borderColor.v._8_8_ = 0;
  local_98.description._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_replace((ulong)&local_98.description,0,(char *)0x0,0x1c5b50c);
  local_98.compareMode = 0x201;
  local_98.compareRef = 1.25;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
  ::push_back(this_00,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.description._M_dataplus._M_p != paVar1) {
    operator_delete(local_98.description._M_dataplus._M_p,
                    CONCAT71(local_98.description.field_2._M_allocated_capacity._1_7_,
                             local_98.description.field_2._M_local_buf[0]) + 1);
  }
  local_98.lookupBias.m_data[0] = 0.0;
  local_98.lookupBias.m_data[1] = 0.0;
  local_98.lookupBias.m_data[2] = 0.0;
  local_98.lookupBias.m_data[3] = 0.0;
  local_98.lookupScale.m_data[0] = 0.0;
  local_98.lookupScale.m_data[1] = 0.0;
  local_98.lookupScale.m_data[2] = 0.0;
  local_98.lookupScale.m_data[3] = 0.0;
  local_98.description._M_string_length = 0;
  local_98.description.field_2._M_local_buf[0] = '\0';
  local_98.p0.m_data[0] = -0.15;
  local_98.p0.m_data[1] = -0.35;
  local_98.p1.m_data[0] = 1.25;
  local_98.p1.m_data[1] = 1.1;
  local_98.borderColor.v._0_8_ = 0xff800000;
  local_98.borderColor.v._8_8_ = 0;
  local_98.description._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_replace((ulong)&local_98.description,0,(char *)0x0,0x1c5b53c);
  local_98.compareMode = 0x204;
  local_98.compareRef = -0.5;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
  ::push_back(this_00,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.description._M_dataplus._M_p != paVar1) {
    operator_delete(local_98.description._M_dataplus._M_p,
                    CONCAT71(local_98.description.field_2._M_allocated_capacity._1_7_,
                             local_98.description.field_2._M_local_buf[0]) + 1);
  }
  pIVar4 = (this->m_iterations).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_iterations).
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar4) >> 3) *
          -0x11111111) {
    lVar5 = 0x6c;
    lVar6 = 0;
    do {
      puVar2 = (undefined8 *)((long)(pIVar4->p0).m_data + lVar5 + -0x4c);
      *puVar2 = 0x3f8000003f800000;
      puVar2[1] = 0x3f8000003f800000;
      puVar2 = (undefined8 *)((long)(pIVar4->p0).m_data + lVar5 + -0x3c);
      *puVar2 = 0;
      puVar2[1] = 0;
      dVar3 = this->m_filter;
      *(deUint32 *)((long)(pIVar4->p0).m_data + lVar5 + -0x2c) = dVar3;
      *(deUint32 *)((long)(&pIVar4->p0 + -5) + lVar5) = dVar3;
      *(undefined8 *)((long)(pIVar4->p0).m_data + lVar5 + -4) = 0x812d0000812d;
      lVar6 = lVar6 + 1;
      pIVar4 = (this->m_iterations).
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x78;
    } while (lVar6 < (int)((ulong)((long)(this->m_iterations).
                                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar4)
                          >> 3) * -0x11111111);
  }
  return (int)pIVar4;
}

Assistant:

void TextureBorderClampDepthCompareCase::init (void)
{
	TextureBorderClampTest::init();

	// 0.5 <= 0.7
	{
		IterationConfig iteration;
		iteration.p0			= tcu::Vec2(-0.15f, -0.35f);
		iteration.p1			= tcu::Vec2( 1.25f,  1.1f);
		iteration.borderColor	= rr::GenericVec4(tcu::Vec4(0.7f, 0.0f, 0.0f, 0.0f));
		iteration.description	= "Border color in [0, 1] range";
		iteration.compareMode	= GL_LEQUAL;
		iteration.compareRef	= 0.5f;
		m_iterations.push_back(iteration);
	}

	// 1.5 <= 1.0
	{
		IterationConfig iteration;
		iteration.p0			= tcu::Vec2(-0.15f, -0.35f);
		iteration.p1			= tcu::Vec2( 1.25f,  1.1f);
		iteration.borderColor	= rr::GenericVec4(tcu::Vec4(1.5f, 0.0f, 0.0f, 0.0f));
		iteration.description	= "Border color > 1, should be clamped";
		iteration.compareMode	= GL_LEQUAL;
		iteration.compareRef	= 1.0f;
		m_iterations.push_back(iteration);
	}

	// -0.5 >= 0.0
	{
		IterationConfig iteration;
		iteration.p0			= tcu::Vec2(-0.15f, -0.35f);
		iteration.p1			= tcu::Vec2( 1.25f,  1.1f);
		iteration.borderColor	= rr::GenericVec4(tcu::Vec4(-0.5f, 0.0f, 0.0f, 0.0f));
		iteration.description	= "Border color < 0, should be clamped";
		iteration.compareMode	= GL_GEQUAL;
		iteration.compareRef	= 0.0f;
		m_iterations.push_back(iteration);
	}

	// inf < 1.25
	{
		IterationConfig iteration;
		iteration.p0			= tcu::Vec2(-0.15f, -0.35f);
		iteration.p1			= tcu::Vec2( 1.25f,  1.1f);
		iteration.borderColor	= rr::GenericVec4(tcu::Vec4(std::numeric_limits<float>::infinity(), 0.0f, 0.0f, 0.0f));
		iteration.description	= "Border color == inf, should be clamped; ref > 1";
		iteration.compareMode	= GL_LESS;
		iteration.compareRef	= 1.25f;
		m_iterations.push_back(iteration);
	}

	// -inf > -0.5
	{
		IterationConfig iteration;
		iteration.p0			= tcu::Vec2(-0.15f, -0.35f);
		iteration.p1			= tcu::Vec2( 1.25f,  1.1f);
		iteration.borderColor	= rr::GenericVec4(tcu::Vec4(-std::numeric_limits<float>::infinity(), 0.0f, 0.0f, 0.0f));
		iteration.description	= "Border color == inf, should be clamped; ref < 0";
		iteration.compareMode	= GL_GREATER;
		iteration.compareRef	= -0.5f;
		m_iterations.push_back(iteration);
	}

	// common parameters
	for (int ndx = 0; ndx < (int)m_iterations.size(); ++ndx)
	{
		IterationConfig& iteration = m_iterations[ndx];

		iteration.lookupScale	= tcu::Vec4(1.0);
		iteration.lookupBias	= tcu::Vec4(0.0);
		iteration.minFilter		= m_filter;
		iteration.magFilter		= m_filter;
		iteration.sWrapMode		= GL_CLAMP_TO_BORDER;
		iteration.tWrapMode		= GL_CLAMP_TO_BORDER;
	}
}